

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

ShaderProgramDeclaration *
deqp::gls::ContextShaderProgram::createProgramDeclaration
          (ShaderProgramDeclaration *__return_storage_ptr__,RenderContext *ctx,
          vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays)

{
  uint uVar1;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays_00;
  RenderContext *ctx_00;
  GenericVecType GVar2;
  int local_d0;
  allocator<char> local_c9;
  ShaderProgramDeclaration *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  GenericVecType local_80;
  ContextShaderProgram *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = (ContextShaderProgram *)ctx;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(__return_storage_ptr__);
  local_d0 = 0;
  local_c8 = __return_storage_ptr__;
  while( true ) {
    arrays_00 = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)
                ((ulong)((long)(arrays->
                               super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(arrays->
                              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
    if ((int)arrays_00 <= local_d0) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"a_",&local_c9);
    de::toString<int>(&local_50,&local_d0);
    std::operator+(&local_c0,&local_70,&local_50);
    uVar1 = (*((arrays->
               super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
               )._M_impl.super__Vector_impl_data._M_start[local_d0]->super_Array)._vptr_Array[10])()
    ;
    GVar2 = GENERICVECTYPE_LAST;
    if (uVar1 < 0xc) {
      GVar2 = *(GenericVecType *)(&DAT_00a29d9c + (ulong)uVar1 * 4);
    }
    std::__cxx11::string::string((string *)local_a0,(string *)&local_c0);
    __return_storage_ptr__ = local_c8;
    local_80 = GVar2;
    sglr::pdec::ShaderProgramDeclaration::operator<<(local_c8,(VertexAttribute *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    local_d0 = local_d0 + 1;
  }
  local_a0._0_4_ = GENERICVECTYPE_FLOAT;
  local_a0[4] = false;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(VertexToFragmentVarying *)local_a0);
  local_a0._0_4_ = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(FragmentOutput *)local_a0);
  genVertexSource_abi_cxx11_(&local_c0,local_78,(RenderContext *)arrays,arrays_00);
  std::__cxx11::string::string((string *)local_a0,(string *)&local_c0);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,(VertexSource *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  genFragmentSource_abi_cxx11_(&local_c0,local_78,ctx_00);
  std::__cxx11::string::string((string *)local_a0,(string *)&local_c0);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(FragmentSource *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"u_coordScale",(allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)local_a0,(string *)&local_c0);
  local_80 = GENERICVECTYPE_UINT32;
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,(Uniform *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"u_colorScale",(allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)local_a0,(string *)&local_c0);
  local_80 = GENERICVECTYPE_UINT32;
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,(Uniform *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

sglr::pdec::ShaderProgramDeclaration ContextShaderProgram::createProgramDeclaration (const glu::RenderContext& ctx, const std::vector<ContextArray*>& arrays)
{
	sglr::pdec::ShaderProgramDeclaration decl;

	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
		decl << sglr::pdec::VertexAttribute(std::string("a_") + de::toString(arrayNdx), mapOutputType(arrays[arrayNdx]->getOutputType()));

	decl << sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT);

	decl << sglr::pdec::VertexSource(genVertexSource(ctx, arrays));
	decl << sglr::pdec::FragmentSource(genFragmentSource(ctx));

	decl << sglr::pdec::Uniform("u_coordScale", glu::TYPE_FLOAT);
	decl << sglr::pdec::Uniform("u_colorScale", glu::TYPE_FLOAT);

	return decl;
}